

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallExpression.cpp
# Opt level: O2

Expression * __thiscall
slang::ast::CallExpression::fromBuiltInMethod
          (CallExpression *this,Compilation *compilation,SymbolKind rootKind,Expression *expr,
          string_view methodName,InvocationExpressionSyntax *syntax,
          ArrayOrRandomizeMethodExpressionSyntax *withClause,ASTContext *context)

{
  Compilation *compilation_00;
  Expression *pEVar1;
  undefined4 in_register_00000014;
  string_view name;
  Scope *in_stack_ffffffffffffffb0;
  SourceRange local_48;
  
  pEVar1 = (Expression *)methodName._M_str;
  name._M_str = (char *)methodName._M_len;
  name._M_len = (size_t)expr;
  compilation_00 =
       (Compilation *)Compilation::getSystemMethod((Compilation *)this,(SymbolKind)compilation,name)
  ;
  if (compilation_00 == (Compilation *)0x0) {
    pEVar1 = (Expression *)0x0;
  }
  else {
    if (pEVar1 == (Expression *)0x0) {
      local_48 = *(SourceRange *)
                  ((long)&(((SystemSubroutine *)CONCAT44(in_register_00000014,rootKind))->name).
                          field_2 + 8);
    }
    else {
      local_48 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)pEVar1);
    }
    pEVar1 = createSystemCall(this,compilation_00,
                              (SystemSubroutine *)CONCAT44(in_register_00000014,rootKind),pEVar1,
                              syntax,withClause,local_48,(ASTContext *)0x0,in_stack_ffffffffffffffb0
                             );
  }
  return pEVar1;
}

Assistant:

Expression* CallExpression::fromBuiltInMethod(
    Compilation& compilation, SymbolKind rootKind, const Expression& expr,
    std::string_view methodName, const InvocationExpressionSyntax* syntax,
    const ArrayOrRandomizeMethodExpressionSyntax* withClause, const ASTContext& context) {

    auto subroutine = compilation.getSystemMethod(rootKind, methodName);
    if (!subroutine)
        return nullptr;

    return &createSystemCall(compilation, *subroutine, &expr, syntax, withClause,
                             syntax ? syntax->sourceRange() : expr.sourceRange, context);
}